

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeParameters.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeParameters::validate(FluctuatingChargeParameters *this)

{
  bool bVar1;
  byte bVar2;
  int data;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RDI;
  double dVar5;
  AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
  *pAVar6;
  RealType one;
  RealType zero;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe198;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  *in_stack_ffffffffffffe1a0;
  undefined6 in_stack_ffffffffffffe1a8;
  undefined1 in_stack_ffffffffffffe1ae;
  undefined1 in_stack_ffffffffffffe1af;
  allocator<char> *in_stack_ffffffffffffe1d0;
  string *in_stack_ffffffffffffe1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe1e0;
  ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *in_stack_ffffffffffffe200;
  undefined6 in_stack_ffffffffffffe208;
  byte in_stack_ffffffffffffe20e;
  undefined1 in_stack_ffffffffffffe20f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe220;
  undefined2 in_stack_ffffffffffffe228;
  undefined1 in_stack_ffffffffffffe22a;
  undefined1 in_stack_ffffffffffffe22b;
  undefined4 in_stack_ffffffffffffe22c;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffffe230;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffffe238;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *pPVar7;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffffe290;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffffe298;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffffe2f0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffffe2f8;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *cons1;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffffe350;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffffe358;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_ffffffffffffe3b0;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffffe3b8;
  string local_1c18 [224];
  undefined8 local_1b38;
  undefined8 local_1b30;
  string local_1b08 [32];
  PositiveConstraint local_1ae8 [2];
  string local_1aa8 [32];
  PositiveConstraint local_1a88;
  ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> local_1a68;
  string local_1a48 [32];
  NonNegativeConstraint local_1a28 [2];
  string local_19e8 [32];
  PositiveConstraint local_19c8;
  allocator<char> local_19a1;
  string local_19a0 [103];
  undefined1 local_1939 [104];
  allocator<char> local_18d1;
  string local_18d0 [512];
  string local_16d0 [32];
  string local_16b0 [39];
  allocator<char> local_1689;
  string local_1688 [103];
  allocator<char> local_1621;
  string local_1620 [103];
  allocator<char> local_15b9;
  string local_15b8 [544];
  string local_1398 [32];
  PositiveConstraint local_1378;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
  local_1358;
  string local_1338 [32];
  NonNegativeConstraint local_1318;
  allocator<char> local_12f1;
  string local_12f0 [103];
  allocator<char> local_1289;
  string local_1288 [103];
  allocator<char> local_1221;
  string local_1220 [103];
  allocator<char> local_11b9;
  string local_11b8 [103];
  allocator<char> local_1151;
  string local_1150 [103];
  allocator<char> local_10e9;
  string local_10e8 [1856];
  string local_9a8 [32];
  string local_988 [39];
  undefined1 local_961 [104];
  undefined1 local_8f9 [104];
  allocator<char> local_891;
  string local_890 [103];
  allocator<char> local_829;
  string local_828 [103];
  allocator<char> local_7c1;
  string local_7c0 [119];
  allocator<char> local_749;
  string local_748 [1864];
  
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x68));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,in_stack_ffffffffffffe1d0
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,in_stack_ffffffffffffe1d0
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
    OpenMD::operator||(in_stack_ffffffffffffe238,in_stack_ffffffffffffe230);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,in_stack_ffffffffffffe1d0
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
    OpenMD::operator||(in_stack_ffffffffffffe298,in_stack_ffffffffffffe290);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,in_stack_ffffffffffffe1d0
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
    OpenMD::operator||(in_stack_ffffffffffffe2f8,in_stack_ffffffffffffe2f0);
    cons1 = (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             *)local_8f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,in_stack_ffffffffffffe1d0
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
    OpenMD::operator||(in_stack_ffffffffffffe358,in_stack_ffffffffffffe350);
    pPVar7 = (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_961;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,in_stack_ffffffffffffe1d0
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
    OpenMD::operator||(in_stack_ffffffffffffe3b8,in_stack_ffffffffffffe3b0);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffffe198);
    bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)CONCAT44(in_stack_ffffffffffffe22c,
                                     CONCAT13(in_stack_ffffffffffffe22b,
                                              CONCAT12(in_stack_ffffffffffffe22a,
                                                       in_stack_ffffffffffffe228))),
                         in_stack_ffffffffffffe220);
    std::__cxx11::string::~string(local_988);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(in_stack_ffffffffffffe1a0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
    std::__cxx11::string::~string((string *)(local_961 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_961);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffffe1a0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
    std::__cxx11::string::~string((string *)(local_8f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_8f9);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffffe1a0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
    std::__cxx11::string::~string(local_890);
    std::allocator<char>::~allocator(&local_891);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffffe1a0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
    std::__cxx11::string::~string(local_828);
    std::allocator<char>::~allocator(&local_829);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffffe1a0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
    std::__cxx11::string::~string(local_7c0);
    std::allocator<char>::~allocator(&local_7c1);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
    std::__cxx11::string::~string(local_748);
    std::allocator<char>::~allocator(&local_749);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x68));
      uVar4 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,
                 in_stack_ffffffffffffe1d0);
      isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,
                 in_stack_ffffffffffffe1d0);
      isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
      OpenMD::operator||(in_stack_ffffffffffffe238,in_stack_ffffffffffffe230);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,
                 in_stack_ffffffffffffe1d0);
      isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
      OpenMD::operator||(in_stack_ffffffffffffe298,in_stack_ffffffffffffe290);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,
                 in_stack_ffffffffffffe1d0);
      isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
      OpenMD::operator||(cons1,pPVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,
                 in_stack_ffffffffffffe1d0);
      isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
      OpenMD::operator||(in_stack_ffffffffffffe358,in_stack_ffffffffffffe350);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,
                 in_stack_ffffffffffffe1d0);
      isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
      OpenMD::operator||(in_stack_ffffffffffffe3b8,in_stack_ffffffffffffe3b0);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffffe198);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar4,uVar3);
      std::__cxx11::string::~string(local_9a8);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(in_stack_ffffffffffffe1a0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
      std::__cxx11::string::~string(local_12f0);
      std::allocator<char>::~allocator(&local_12f1);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffffe1a0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
      std::__cxx11::string::~string(local_1288);
      std::allocator<char>::~allocator(&local_1289);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffffe1a0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
      std::__cxx11::string::~string(local_1220);
      std::allocator<char>::~allocator(&local_1221);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffffe1a0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
      std::__cxx11::string::~string(local_11b8);
      std::allocator<char>::~allocator(&local_11b9);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffffe1a0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
      std::__cxx11::string::~string(local_1150);
      std::allocator<char>::~allocator(&local_1151);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
      std::__cxx11::string::~string(local_10e8);
      std::allocator<char>::~allocator(&local_10e9);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x138));
  if (!bVar1) {
    isNonNegative();
    dVar5 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x138));
    bVar1 = NonNegativeConstraint::operator()(&local_1318,dVar5);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x202c91);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x138));
      in_stack_ffffffffffffe290 =
           (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)std::__cxx11::string::c_str()
      ;
      in_stack_ffffffffffffe298 = &local_1358;
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_ffffffffffffe198);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",
               in_stack_ffffffffffffe290,uVar4);
      std::__cxx11::string::~string(local_1338);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x202d3d);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x170));
  if (!bVar1) {
    isPositive();
    dVar5 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x170));
    bVar1 = PositiveConstraint::operator()(&local_1378,dVar5);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x202e38);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x170));
      uVar4 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffffe198);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar4,uVar3);
      std::__cxx11::string::~string(local_1398);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x202ee4);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xe8));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,in_stack_ffffffffffffe1d0
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,in_stack_ffffffffffffe1d0
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
    OpenMD::operator||(in_stack_ffffffffffffe238,in_stack_ffffffffffffe230);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,in_stack_ffffffffffffe1d0
              );
    isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
    OpenMD::operator||(in_stack_ffffffffffffe298,in_stack_ffffffffffffe290);
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffffe198);
    bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)CONCAT44(in_stack_ffffffffffffe22c,
                                     CONCAT13(in_stack_ffffffffffffe22b,
                                              CONCAT12(in_stack_ffffffffffffe22a,
                                                       in_stack_ffffffffffffe228))),
                         in_stack_ffffffffffffe220);
    std::__cxx11::string::~string(local_16b0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)in_stack_ffffffffffffe1a0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
    std::__cxx11::string::~string(local_1688);
    std::allocator<char>::~allocator(&local_1689);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)in_stack_ffffffffffffe1a0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
    std::__cxx11::string::~string(local_1620);
    std::allocator<char>::~allocator(&local_1621);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
    std::__cxx11::string::~string(local_15b8);
    std::allocator<char>::~allocator(&local_15b9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xe8));
      uVar4 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,
                 in_stack_ffffffffffffe1d0);
      isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
      pPVar7 = (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)local_1939;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,
                 in_stack_ffffffffffffe1d0);
      isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
      OpenMD::operator||(pPVar7,in_stack_ffffffffffffe230);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe1e0,(char *)in_stack_ffffffffffffe1d8,
                 in_stack_ffffffffffffe1d0);
      isEqualIgnoreCase(in_stack_ffffffffffffe1d8);
      OpenMD::operator||(in_stack_ffffffffffffe298,in_stack_ffffffffffffe290);
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_ffffffffffffe198);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar4,uVar3);
      std::__cxx11::string::~string(local_16d0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)in_stack_ffffffffffffe1a0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
      std::__cxx11::string::~string(local_19a0);
      std::allocator<char>::~allocator(&local_19a1);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)in_stack_ffffffffffffe1a0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
      std::__cxx11::string::~string((string *)(local_1939 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1939);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_ffffffffffffe1a0);
      std::__cxx11::string::~string(local_18d0);
      std::allocator<char>::~allocator(&local_18d1);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x1a8));
  if (!bVar1) {
    isPositive();
    data = Parameter<int>::getData((Parameter<int> *)(in_RDI + 0x1a8));
    bVar1 = PositiveConstraint::operator()(&local_19c8,data);
    bVar2 = bVar1 ^ 0xff;
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x203752);
    if ((bVar2 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x1a8));
      uVar4 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffffe198);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar4,uVar3);
      std::__cxx11::string::~string(local_19e8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x2037fe);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x1d8));
  if (!bVar1) {
    isNonNegative();
    dVar5 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x1d8));
    in_stack_ffffffffffffe20f = NonNegativeConstraint::operator()(local_1a28,dVar5);
    in_stack_ffffffffffffe20e = in_stack_ffffffffffffe20f ^ 0xff;
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x2038ea);
    if ((in_stack_ffffffffffffe20e & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x1d8));
      uVar4 = std::__cxx11::string::c_str();
      in_stack_ffffffffffffe200 = &local_1a68;
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_ffffffffffffe198);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar4,uVar3);
      std::__cxx11::string::~string(local_1a48);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x203987);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x210));
  if (!bVar1) {
    isPositive();
    dVar5 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x210));
    bVar1 = PositiveConstraint::operator()(&local_1a88,dVar5);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x203a73);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x210));
      uVar4 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffffe198);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar4,uVar3);
      std::__cxx11::string::~string(local_1aa8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x203b10);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x248));
  if (!bVar1) {
    isPositive();
    dVar5 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x248));
    bVar1 = PositiveConstraint::operator()(local_1ae8,dVar5);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x203bfc);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x248));
      uVar4 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_ffffffffffffe198);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar4,uVar3);
      std::__cxx11::string::~string(local_1b08);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x203c99);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  local_1b30 = 0;
  local_1b38 = 0x3ff0000000000000;
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x2b0));
  if (!bVar1) {
    isGreaterThan<double>((double *)in_stack_ffffffffffffe198);
    isLessThanOrEqualTo<double>((double *)in_stack_ffffffffffffe198);
    operator&&((ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *)
               CONCAT17(in_stack_ffffffffffffe20f,
                        CONCAT16(in_stack_ffffffffffffe20e,in_stack_ffffffffffffe208)),
               in_stack_ffffffffffffe200);
    pAVar6 = (AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
              *)Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x2b0));
    bVar1 = AndParamConstraint<OpenMD::GreaterThanConstraint<double>,OpenMD::LessThanOrEqualToConstraint<double>>
            ::operator()(pAVar6,(double)CONCAT17(in_stack_ffffffffffffe1af,
                                                 CONCAT16(in_stack_ffffffffffffe1ae,
                                                          in_stack_ffffffffffffe1a8)));
    bVar2 = bVar1 ^ 0xff;
    AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
    ::~AndParamConstraint
              ((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                *)in_stack_ffffffffffffe1a0);
    LessThanOrEqualToConstraint<double>::~LessThanOrEqualToConstraint
              ((LessThanOrEqualToConstraint<double> *)0x203ded);
    GreaterThanConstraint<double>::~GreaterThanConstraint((GreaterThanConstraint<double> *)0x203dfa)
    ;
    if ((bVar2 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x2b0));
      pAVar6 = (AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                *)std::__cxx11::string::c_str();
      isGreaterThan<double>((double *)in_stack_ffffffffffffe198);
      isLessThanOrEqualTo<double>((double *)in_stack_ffffffffffffe198);
      operator&&((ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *)
                 CONCAT17(in_stack_ffffffffffffe20f,
                          CONCAT16(in_stack_ffffffffffffe20e,in_stack_ffffffffffffe208)),
                 in_stack_ffffffffffffe200);
      ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,OpenMD::LessThanOrEqualToConstraint<double>>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
                  *)in_stack_ffffffffffffe198);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pAVar6,uVar4);
      std::__cxx11::string::~string(local_1c18);
      AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
      ::~AndParamConstraint(pAVar6);
      LessThanOrEqualToConstraint<double>::~LessThanOrEqualToConstraint
                ((LessThanOrEqualToConstraint<double> *)0x203ee0);
      GreaterThanConstraint<double>::~GreaterThanConstraint
                ((GreaterThanConstraint<double> *)0x203eed);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void FluctuatingChargeParameters::validate() {
    CheckParameter(Propagator,
                   isEqualIgnoreCase("Damped") || isEqualIgnoreCase("NVT") ||
                       isEqualIgnoreCase("Langevin") ||
                       isEqualIgnoreCase("Minimizer") ||
                       isEqualIgnoreCase("NVE") || isEqualIgnoreCase("Exact"));
    CheckParameter(Friction, isNonNegative());
    CheckParameter(Tolerance, isPositive());
    CheckParameter(ChargeOptimizationMethod, isEqualIgnoreCase("SD") ||
                                                 isEqualIgnoreCase("CG") ||
                                                 isEqualIgnoreCase("BFGS"));
    CheckParameter(MaxIterations, isPositive());
    CheckParameter(TargetTemp, isNonNegative());
    CheckParameter(TauThermostat, isPositive());
    CheckParameter(DragCoefficient, isPositive());
    RealType zero = 0.0;
    RealType one  = 1.0;
    CheckParameter(InitialStepSize,
                   isGreaterThan(zero) && isLessThanOrEqualTo(one));
  }